

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O3

string * __thiscall
toml::detail::character_either::expected_chars_abi_cxx11_
          (string *__return_storage_ptr__,character_either *this,location *param_1)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  byte *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar6 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar8 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pbVar8 - (long)pbVar6 == 1) {
    show_char_abi_cxx11_(&local_b0,(detail *)(ulong)*pbVar6,(int)pbVar8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    local_50.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0035ee35;
  }
  if ((long)pbVar8 - (long)pbVar6 != 2) {
    if (pbVar8 == pbVar6) {
      return __return_storage_ptr__;
    }
    uVar10 = 0;
    while( true ) {
      if (uVar10 != 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,", ");
        pbVar6 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar1 = uVar10 + 1;
      uVar9 = (long)pbVar8 - (long)pbVar6;
      if (uVar1 == uVar9) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"or ");
        pbVar6 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = (long)(this->chars_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pbVar6;
      }
      if (uVar9 <= uVar10) break;
      show_char_abi_cxx11_(&local_b0,(detail *)(ulong)pbVar6[uVar10],(int)uVar9);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pbVar6 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pbVar8 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar10 = uVar1;
      if ((ulong)((long)pbVar8 - (long)pbVar6) <= uVar1) {
        return __return_storage_ptr__;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
  }
  show_char_abi_cxx11_(&local_50,(detail *)(ulong)*pbVar6,(int)pbVar8);
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                  " or ");
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar7) {
    local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_90.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_90.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    local_90._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  puVar3 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  if (uVar10 < 2) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  }
  show_char_abi_cxx11_(&local_70,(detail *)(ulong)puVar3[1],(int)uVar10);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    uVar11 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_70._M_string_length + local_90._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar11 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_70._M_string_length + local_90._M_string_length) goto LAB_0035ed62;
    pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
  }
  else {
LAB_0035ed62:
    pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_90,local_70._M_dataplus._M_p,local_70._M_string_length);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar7) {
    local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return __return_storage_ptr__;
  }
LAB_0035ee35:
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character_either::expected_chars(location&) const
{
    assert( ! chars_.empty());

    std::string expected;
    if(chars_.size() == 1)
    {
        expected += show_char(chars_.at(0));
    }
    else if(chars_.size() == 2)
    {
        expected += show_char(chars_.at(0)) + " or " + show_char(chars_.at(1));
    }
    else
    {
        for(std::size_t i=0; i<chars_.size(); ++i)
        {
            if(i != 0)
            {
                expected += ", ";
            }
            if(i + 1 == chars_.size())
            {
                expected += "or ";
            }
            expected += show_char(chars_.at(i));
        }
    }
    return expected;
}